

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::_InternalSerialize
          (BiDirectionalLSTMLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint8_t *puVar2;
  Type *pTVar3;
  Type *value;
  ulong uVar4;
  int iVar5;
  
  if (this->inputvectorsize_ != 0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt64ToArray
                       (1,this->inputvectorsize_,puVar2);
  }
  if (this->outputvectorsize_ != 0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt64ToArray
                       (2,this->outputvectorsize_,puVar2);
  }
  iVar1 = (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                       (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::ActivationParams>(10,pTVar3,puVar2,stream);
  }
  iVar1 = (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                       (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::ActivationParams>(0xb,pTVar3,puVar2,stream)
    ;
  }
  if ((this != (BiDirectionalLSTMLayerParams *)_BiDirectionalLSTMLayerParams_default_instance_) &&
     (this->params_ != (LSTMParams *)0x0)) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::LSTMParams>
                       (0xf,this->params_,puVar2,stream);
  }
  iVar1 = (this->weightparams_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                      (&(this->weightparams_).super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::LSTMWeightParams>(0x14,value,puVar2,stream)
    ;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) == 0) {
    return target;
  }
  uVar4 = uVar4 & 0xfffffffffffffffc;
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  return puVar2;
}

Assistant:

uint8_t* BiDirectionalLSTMLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_inputvectorsize(), target);
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_outputvectorsize(), target);
  }

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_activationsforwardlstm_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(10, this->_internal_activationsforwardlstm(i), target, stream);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_activationsbackwardlstm_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(11, this->_internal_activationsbackwardlstm(i), target, stream);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        15, _Internal::params(this), target, stream);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_weightparams_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(20, this->_internal_weightparams(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return target;
}